

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

string_type * __thiscall parser::state::string_abi_cxx11_(state *this,posn *p,ind n)

{
  string_type *in_RDI;
  range_type iters;
  allocator<char> local_a1;
  _Deque_iterator<char,_char_&,_char_*> local_a0;
  allocator<char> *in_stack_ffffffffffffff88;
  _Deque_iterator<char,_char_&,_char_*> *in_stack_ffffffffffffff90;
  _Deque_iterator<char,_char_&,_char_*> *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  _Deque_iterator<char,_char_&,_char_*> local_40 [2];
  
  range((state *)iters.second._M_last,(posn *)iters.second._M_first,(ind)iters.second._M_cur);
  std::_Deque_iterator<char,_char_&,_char_*>::_Deque_iterator
            ((_Deque_iterator<char,_char_&,_char_*> *)&stack0xffffffffffffff80,
             (_Deque_iterator<char,_char_&,_char_*> *)&stack0xffffffffffffffa0);
  std::_Deque_iterator<char,_char_&,_char_*>::_Deque_iterator(&local_a0,local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::_Deque_iterator<char,char&,char*>,void>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88);
  std::allocator<char>::~allocator(&local_a1);
  return in_RDI;
}

Assistant:

string_type string(const struct posn& p, ind n) {
			range_type iters = range(p, n);
			return string_type(iters.first, iters.second);
		}